

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O2

void amrex::anon_unknown_22::chop_boxes_dir(Box *bxv,Box *bx,int nboxes,int idir)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  Box bxleft;
  Box bxright;
  
  if (nboxes == 1) {
    uVar1 = *(undefined8 *)(bx->smallend).vect;
    uVar2 = *(undefined8 *)((bx->smallend).vect + 2);
    uVar3 = *(undefined8 *)((bx->bigend).vect + 2);
    *(undefined8 *)(bxv->bigend).vect = *(undefined8 *)(bx->bigend).vect;
    *(undefined8 *)((bxv->bigend).vect + 2) = uVar3;
    *(undefined8 *)(bxv->smallend).vect = uVar1;
    *(undefined8 *)((bxv->smallend).vect + 2) = uVar2;
  }
  else {
    iVar4 = (bx->smallend).vect[idir];
    bxleft.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
    uVar1 = *(undefined8 *)((bx->smallend).vect + 2);
    bxleft._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
    bxleft.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
    bxleft.smallend.vect[2] = (int)uVar1;
    bxleft.bigend.vect[0] = (int)((ulong)uVar1 >> 0x20);
    Box::chop(&bxright,&bxleft,idir,iVar4 + (((bx->bigend).vect[idir] - iVar4) + 1) / 2);
    iVar4 = nboxes / 2;
    chop_boxes_dir(bxv,&bxleft,iVar4,idir);
    chop_boxes_dir(bxv + iVar4,&bxright,nboxes - iVar4,idir);
  }
  return;
}

Assistant:

static void chop_boxes_dir (Box* bxv, const Box& bx, int nboxes, int idir)
{
    if (nboxes == 1)
    {
        *bxv = bx;
    }
    else
    {
        int chop_pnt = bx.smallEnd(idir) + bx.length(idir)/2;
        Box bxleft = bx;
        Box bxright = bxleft.chop(idir, chop_pnt);

        int nleft = nboxes / 2;
        chop_boxes_dir(bxv, bxleft, nleft, idir);

        int nright = nboxes - nleft;
        chop_boxes_dir(bxv+nleft, bxright, nright, idir);
    }
}